

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAddons.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  char *pcVar8;
  byte bVar9;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  
  stringArgs_abi_cxx11_(&local_80,argc,argv);
  bVar7 = false;
  bVar9 = 0;
  while (local_80.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar1 = std::operator==(local_80.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur,"debug");
    bVar2 = hasInfo(local_80.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur);
    bVar3 = hasGpuID(local_80.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur);
    if (bVar3) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&local_80);
      getGpuID(&local_80);
    }
    bVar9 = bVar9 | bVar1;
    bVar7 = (bool)(bVar7 | bVar2);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&local_80);
  }
  if (bVar9 == 0) {
    std::operator<<((ostream *)&std::cout,"\n\n");
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "          Tasmanian Addons Module: Functionality Test");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------"
                            );
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar7 = testConstructSurrogate(bVar7);
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x28;
    poVar4 = std::operator<<((ostream *)&std::cout,"Automated construction");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
    pcVar8 = "FAIL";
    pcVar6 = "FAIL";
    if (bVar7) {
      pcVar6 = "Pass";
    }
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x28;
    poVar4 = std::operator<<((ostream *)&std::cout,"Unstructured construction");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
    poVar4 = std::operator<<(poVar4,"skipping");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar1 = testExoticQuadrature();
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x28;
    poVar4 = std::operator<<((ostream *)&std::cout,"Exotic quadrature");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
    pcVar6 = "FAIL";
    if (bVar1) {
      pcVar6 = "Pass";
    }
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar2 = testGetSubrules();
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x28;
    poVar4 = std::operator<<((ostream *)&std::cout,"CustomTabulated manipulation");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 10;
    if (bVar2) {
      pcVar8 = "Pass";
    }
    poVar4 = std::operator<<(poVar4,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"\n");
    if (bVar2) {
      pcVar6 = "---------------------------------------------------------------------";
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "---------------------------------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "               All Tests Completed Successfully");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      pcVar6 = "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL";
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"         Some Tests Have Failed");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar5 = (uint)((!bVar7 || !bVar1) || !bVar2);
  }
  else {
    uVar5 = 0;
    debugTest();
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_80);
  return uVar5;
}

Assistant:

int main(int argc, char const **argv){

    std::deque<std::string> args = stringArgs(argc, argv);

    bool debug = false;
    bool pass_all = true;
    bool verbose = false;
    int gpuid = -1;

    while(not args.empty()){
        if (args.front() == "debug") debug = true;
        if (hasInfo(args.front())) verbose = true;
        if (hasGpuID(args.front())){
            args.pop_front();
            gpuid = getGpuID(args);
        }
        args.pop_front();
    }

    if (debug){
        debugTest();
        return 0;
    }

    cout << "\n\n";
    cout << "---------------------------------------------------------------------" << endl;
    cout << "          Tasmanian Addons Module: Functionality Test" << endl;
    cout << "---------------------------------------------------------------------" << endl << endl;

    bool pass = testConstructSurrogate(verbose);
    cout << std::setw(40) << "Automated construction" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    #if defined(Tasmanian_ENABLE_BLAS) || defined(Tasmanian_ENABLE_GPU)
    pass = true;
    pass = testLoadUnstructuredL2(verbose, gpuid);
    cout << std::setw(40) << "Unstructured construction" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;
    #else
    cout << std::setw(40) << "Unstructured construction" << std::setw(10) << "skipping" << endl;
    gpuid *= 2; // no op to register the use of gpuid
    #endif

    // Tests for Exotic Quadrature.
    pass = true;
    pass = testExoticQuadrature();
    cout << std::setw(40) << "Exotic quadrature" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    // Tests for manipulating CustomTabulated objects.
    pass = true;
    pass = testCustomTabulated();
    cout << std::setw(40) << "CustomTabulated manipulation" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    cout << "\n";
    if (pass){
        cout << "---------------------------------------------------------------------" << endl;
        cout << "               All Tests Completed Successfully" << endl;
        cout << "---------------------------------------------------------------------" << endl << endl;
    }else{
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl;
        cout << "         Some Tests Have Failed" << endl;
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl << endl;
    }

    return ((pass_all) ? 0 : 1);

}